

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_tif_info(uint32_t width,uint32_t height,uint16_t bps,uint16_t spp,uint16_t config,
                   uint16_t type)

{
  ostream *poVar1;
  uint16_t type_local;
  uint16_t config_local;
  uint16_t spp_local;
  uint16_t bps_local;
  uint32_t height_local;
  uint32_t width_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"  Resolution: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,width);
  poVar1 = std::operator<<(poVar1,"px x ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,height);
  poVar1 = std::operator<<(poVar1,"px");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"  Type: ");
  switch(type) {
  case 1:
    poVar1 = std::operator<<((ostream *)&std::cout,"uint");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,bps);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 2:
    poVar1 = std::operator<<((ostream *)&std::cout,"int");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,bps);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 3:
    poVar1 = std::operator<<((ostream *)&std::cout,"float");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,bps);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 4:
    poVar1 = std::operator<<((ostream *)&std::cout,"void");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,bps);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 5:
    poVar1 = std::operator<<((ostream *)&std::cout,"complex int");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,bps);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 6:
    poVar1 = std::operator<<((ostream *)&std::cout,"complex float");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,bps);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cout,"unrecognized");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"  Planar config:");
  if (config == 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"contig");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else if (config == 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"separate");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"unrecognized");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void print_tif_info(
    uint32_t width, uint32_t height,
    uint16_t bps, uint16_t spp,
    uint16_t config,
    uint16_t type)
{
    std::cout << "  Resolution: " << width << "px x " <<  height << "px" << std::endl;
    std::cout << "  Type: ";

    switch (type) {
        case SAMPLEFORMAT_UINT:
            std::cout << "uint" << bps << std::endl;
            break;
        case SAMPLEFORMAT_INT:
            std::cout << "int" << bps << std::endl;
            break;
        case SAMPLEFORMAT_IEEEFP:
            std::cout << "float" << bps << std::endl;
            break;
        case SAMPLEFORMAT_VOID:
            std::cout << "void" << bps << std::endl;
            break;
        case SAMPLEFORMAT_COMPLEXINT:
            std::cout << "complex int" << bps << std::endl;
            break;
        case SAMPLEFORMAT_COMPLEXIEEEFP:
            std::cout << "complex float" << bps << std::endl;
            break;
        default:
            std::cout << "unrecognized" << std::endl;
            break;
    }

    std::cout << "  Planar config:";

    switch (config) {
        case PLANARCONFIG_CONTIG:
            std::cout << "contig" << std::endl;
            break;
        case PLANARCONFIG_SEPARATE:
            std::cout << "separate" << std::endl;
            break;
        default:
            std::cout << "unrecognized" << std::endl;
            break;
    }
}